

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

int Acb_CheckMiter(Cnf_Dat_t *pCnf)

{
  int iVar1;
  sat_solver *s;
  sat_solver *pSat;
  int status;
  int Lit;
  int i;
  int iCoVarBeg;
  Cnf_Dat_t *pCnf_local;
  
  Lit = 1;
  _i = pCnf;
  s = sat_solver_new();
  sat_solver_setnvars(s,_i->nVars);
  status = 0;
  while( true ) {
    if (_i->nClauses <= status) {
      pSat._4_4_ = Abc_Var2Lit(Lit,0);
      iVar1 = sat_solver_addclause(s,(lit *)((long)&pSat + 4),&status);
      if (iVar1 == 0) {
        pCnf_local._4_4_ = 1;
      }
      else {
        pSat._0_4_ = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
        sat_solver_delete(s);
        pCnf_local._4_4_ = (uint)((int)pSat == -1);
      }
      return pCnf_local._4_4_;
    }
    iVar1 = sat_solver_addclause(s,_i->pClauses[status],_i->pClauses[status + 1]);
    if (iVar1 == 0) break;
    status = status + 1;
  }
  return 1;
}

Assistant:

int Acb_CheckMiter( Cnf_Dat_t * pCnf )
{
    int iCoVarBeg = 1, i, Lit, status;
    sat_solver * pSat = sat_solver_new(); 
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return 1;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return 1;
    status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
    sat_solver_delete( pSat );
    return status == l_False;
}